

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

DatatypeValidator * __thiscall
xercesc_4_0::TraverseSchema::findDTValidator
          (TraverseSchema *this,DOMElement *elem,XMLCh *derivedTypeName,XMLCh *baseTypeName,
          int baseRefContext)

{
  XMLBuffer *this_00;
  ulong uVar1;
  short *psVar2;
  XMLCh XVar3;
  XMLCh XVar4;
  XMLStringPool *pXVar5;
  SchemaInfo *toRestore;
  ValueVectorOf<int> *pVVar6;
  ulong uVar7;
  RefVectorOf<xercesc_4_0::SchemaInfo> *pRVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DatatypeValidator *pDVar12;
  XMLCh *pXVar13;
  SchemaInfo *toRestore_00;
  DOMElement *childElem;
  XMLCh *pXVar14;
  XMLSize_t XVar15;
  XMLSize_t getAt;
  ulong uVar16;
  SchemaInfo *pSVar17;
  ListType aListType;
  XMLCh *pXVar18;
  XMLCh *pXVar19;
  bool bVar20;
  
  iVar10 = XMLString::indexOf(baseTypeName,L':');
  if (iVar10 + 1U < 2) {
    pXVar18 = L"";
  }
  else {
    (this->fBuffer).fIndex = 0;
    XMLBuffer::append(&this->fBuffer,baseTypeName,(long)iVar10);
    pXVar5 = this->fStringPool;
    (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
    uVar11 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[5])(pXVar5);
    iVar10 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[10])(pXVar5,(ulong)uVar11);
    pXVar18 = (XMLCh *)CONCAT44(extraout_var,iVar10);
  }
  iVar10 = XMLString::indexOf(baseTypeName,L':');
  XVar15 = 0;
  if (baseTypeName != (XMLCh *)0x0) {
    do {
      psVar2 = (short *)((long)baseTypeName + XVar15);
      XVar15 = XVar15 + 2;
    } while (*psVar2 != 0);
    XVar15 = ((long)XVar15 >> 1) - 1;
  }
  if (XVar15 == (long)(iVar10 + 1)) {
    pXVar19 = L"";
  }
  else {
    this_00 = &this->fBuffer;
    if (iVar10 == -1) {
      this_00->fIndex = 0;
      pXVar19 = baseTypeName;
    }
    else {
      XVar15 = XVar15 + ~(long)iVar10;
      this_00->fIndex = 0;
      pXVar19 = baseTypeName + (long)iVar10 + 1;
    }
    XMLBuffer::append(this_00,pXVar19,XVar15);
    pXVar5 = this->fStringPool;
    (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
    uVar11 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[5])(pXVar5);
    iVar10 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[10])(pXVar5,(ulong)uVar11);
    pXVar19 = (XMLCh *)CONCAT44(extraout_var_00,iVar10);
  }
  pXVar18 = resolvePrefixToURI(this,elem,pXVar18);
  pDVar12 = getDatatypeValidator(this,pXVar18,pXVar19);
  if (pDVar12 == (DatatypeValidator *)0x0) {
    if (pXVar18 == L"http://www.w3.org/2001/XMLSchema") {
LAB_0032fdc9:
      pXVar13 = L"http://apache.org/xml/messages/XMLErrors";
      iVar10 = 0x28;
      baseTypeName = pXVar18;
      derivedTypeName = pXVar19;
    }
    else {
      pXVar13 = L"http://www.w3.org/2001/XMLSchema";
      pXVar14 = pXVar18;
      if (pXVar18 == (XMLCh *)0x0) {
LAB_0032fc44:
        if (*pXVar13 == L'\0') goto LAB_0032fdc9;
      }
      else {
        do {
          XVar3 = *pXVar14;
          if (XVar3 == L'\0') goto LAB_0032fc44;
          XVar4 = *pXVar13;
          pXVar13 = pXVar13 + 1;
          pXVar14 = pXVar14 + 1;
        } while (XVar3 == XVar4);
      }
      toRestore = this->fSchemaInfo;
      uVar11 = this->fCurrentScope;
      pXVar13 = this->fTargetNSURIString;
      aListType = INCLUDE;
      pSVar17 = toRestore;
      if (pXVar18 != pXVar13) {
        pXVar14 = pXVar18;
        if (pXVar13 == (XMLCh *)0x0 || pXVar18 == (XMLCh *)0x0) {
          if (pXVar18 == (XMLCh *)0x0) {
            if (pXVar13 == (XMLCh *)0x0) goto LAB_0032fe18;
          }
          else {
            bVar20 = *pXVar18 == L'\0';
            if ((pXVar13 == (XMLCh *)0x0) || (*pXVar18 != L'\0')) goto LAB_0032fcd3;
          }
LAB_0032fccc:
          bVar20 = *pXVar13 == L'\0';
        }
        else {
          do {
            XVar3 = *pXVar14;
            if (XVar3 == L'\0') goto LAB_0032fccc;
            XVar4 = *pXVar13;
            pXVar13 = pXVar13 + 1;
            pXVar14 = pXVar14 + 1;
          } while (XVar3 == XVar4);
          bVar20 = false;
        }
LAB_0032fcd3:
        if (((pXVar18 == (XMLCh *)0x0) || (bVar20)) || (*pXVar18 == L'\0')) goto LAB_0032fe18;
        iVar10 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])();
        pVVar6 = this->fImportedNSList;
        if ((pVVar6 != (ValueVectorOf<int> *)0x0) && (uVar7 = pVVar6->fCurCount, uVar7 != 0)) {
          if (*pVVar6->fElemList != iVar10) {
            uVar16 = 0;
            do {
              if (uVar7 - 1 == uVar16) goto LAB_0032fda0;
              uVar1 = uVar16 + 1;
              lVar9 = uVar16 + 1;
              uVar16 = uVar1;
            } while (pVVar6->fElemList[lVar9] != iVar10);
            if (uVar7 <= uVar1) goto LAB_0032fda0;
          }
          pSVar17 = this->fSchemaInfo;
          pRVar8 = pSVar17->fImportedInfoList;
          if ((pRVar8 != (RefVectorOf<xercesc_4_0::SchemaInfo> *)0x0) &&
             (XVar15 = (pRVar8->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fCurCount,
             XVar15 != 0)) {
            getAt = 0;
            do {
              toRestore_00 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt
                                       (&pSVar17->fImportedInfoList->
                                         super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,getAt);
              if (toRestore_00->fTargetNSURI == iVar10) {
                if (toRestore_00->fProcessed != true) {
                  restoreSchemaInfo(this,toRestore_00,IMPORT,0xfffffffe);
                  aListType = IMPORT;
                  pSVar17 = this->fSchemaInfo;
                  goto LAB_0032fe18;
                }
                break;
              }
              getAt = getAt + 1;
            } while (XVar15 != getAt);
          }
          goto LAB_0032fdc9;
        }
LAB_0032fda0:
        iVar10 = 0x8e;
        goto LAB_0032fc01;
      }
LAB_0032fe18:
      childElem = SchemaInfo::getTopLevelComponent
                            (pSVar17,1,L"simpleType",pXVar19,&this->fSchemaInfo);
      if (childElem != (DOMElement *)0x0) {
        pDVar12 = traverseSimpleTypeDecl(this,childElem,true,0);
        if (toRestore != this->fSchemaInfo) {
          restoreSchemaInfo(this,toRestore,aListType,uVar11);
        }
        if (pDVar12 != (DatatypeValidator *)0x0) goto LAB_0032fbd6;
      }
      pXVar13 = L"http://apache.org/xml/messages/XMLValidity";
      iVar10 = 0x1e;
    }
    reportSchemaError(this,elem,pXVar13,iVar10,baseTypeName,derivedTypeName,(XMLCh *)0x0,
                      (XMLCh *)0x0);
  }
  else {
LAB_0032fbd6:
    if ((pDVar12->fFinalSet & baseRefContext) == 0) {
      return pDVar12;
    }
    iVar10 = 0x3e;
    pXVar18 = baseTypeName;
LAB_0032fc01:
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",iVar10,pXVar18,
                      (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
  }
  return (DatatypeValidator *)0x0;
}

Assistant:

DatatypeValidator*
TraverseSchema::findDTValidator(const DOMElement* const elem,
                                const XMLCh* const derivedTypeName,
                                const XMLCh* const baseTypeName,
                                const int baseRefContext) {

    const XMLCh*       prefix = getPrefix(baseTypeName);
    const XMLCh*       localPart = getLocalPart(baseTypeName);
    const XMLCh*       uri = resolvePrefixToURI(elem, prefix);
    DatatypeValidator* baseValidator = getDatatypeValidator(uri, localPart);

    if (baseValidator == 0) {

        // Check if the base is from the schema for schema namespace
        //
        if (XMLString::equals(uri, SchemaSymbols::fgURI_SCHEMAFORSCHEMA))
        {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TypeNotFound, uri, localPart);
            return 0;
        }

        SchemaInfo::ListType infoType = SchemaInfo::INCLUDE;
        SchemaInfo* saveInfo = fSchemaInfo;
        unsigned int         saveScope = fCurrentScope;

        if (!XMLString::equals(uri, fTargetNSURIString) && (uri && *uri)) {

            // Make sure that we have an explicit import statement.
            // Clause 4 of Schema Representation Constraint:
            // http://www.w3.org/TR/xmlschema-1/#src-resolve
            unsigned int uriId = fURIStringPool->addOrFind(uri);

            if (!isImportingNS(uriId)) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidNSReference, uri);
                return 0;
            }

            SchemaInfo* impInfo = fSchemaInfo->getImportInfo(uriId);

            if (!impInfo || impInfo->getProcessed())
            {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TypeNotFound, uri, localPart);
                return 0;
            }

            infoType = SchemaInfo::IMPORT;
            restoreSchemaInfo(impInfo, infoType);
        }

        DOMElement* baseTypeNode = fSchemaInfo->getTopLevelComponent(SchemaInfo::C_SimpleType,
            SchemaSymbols::fgELT_SIMPLETYPE, localPart, &fSchemaInfo);

        if (baseTypeNode != 0) {

            baseValidator = traverseSimpleTypeDecl(baseTypeNode);

            // restore schema information, if necessary
            if (saveInfo != fSchemaInfo) {
                restoreSchemaInfo(saveInfo, infoType, saveScope);
            }
        }
    }

    if (baseValidator == 0) {
        reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::UnknownBaseDatatype, baseTypeName, derivedTypeName);
    }
    else if ((baseValidator->getFinalSet() & baseRefContext) != 0) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DisallowedBaseDerivation, baseTypeName);
        return 0;
    }

    return baseValidator;
}